

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::words(Forth *this)

{
  anon_class_16_2_d92de223 __f;
  undefined1 local_30 [20];
  WriteTarget local_1c;
  stringstream *psStack_18;
  WriteTarget param;
  stringstream *buf;
  Forth *this_local;
  
  psStack_18 = &this->std_cout;
  local_1c = this->writeToTarget;
  buf = (stringstream *)this;
  std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::rbegin
            ((vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_> *)
             (local_30 + 8));
  std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::rend
            ((vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_> *)
             local_30);
  __f.param = &local_1c;
  __f.buf = psStack_18;
  std::
  for_each<std::reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition*,std::vector<cppforth::Forth::Definition,std::allocator<cppforth::Forth::Definition>>>>,cppforth::Forth::words()::_lambda(cppforth::Forth::Definition&)_1_>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
              *)(local_30 + 8),
             (reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
              *)local_30,__f);
  return;
}

Assistant:

void words() {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			std::stringstream &buf = std_cout;
			auto param = writeToTarget;
			std::for_each(definitions.rbegin(), definitions.rend(), [&buf,&param](Definition& defn) {
				if (defn.isFindable()) {
					switch (param) {
					case ToString:
						buf << defn.name << " ";
						break;
					case ToStdCout:
						std::cout << defn.name << " ";
						std::cout.flush();
						break;
					default:
						break;
					}
				}
			});
#endif
		}